

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendar.cpp
# Opt level: O0

QStringList * __thiscall QtPrivate::QCalendarRegistry::availableCalendars(QCalendarRegistry *this)

{
  long lVar1;
  QCalendarRegistry *in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QReadLocker locker;
  QList<QString> *in_stack_ffffffffffffffb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ensurePopulated(in_RSI);
  QReadLocker::QReadLocker((QReadLocker *)in_RDI,(QReadWriteLock *)in_stack_ffffffffffffffb8);
  QFlatMap<QString,_QCalendarBackend_*,_QCalendarRegistryCaseInsensitiveAnyStringViewLessThan,_QList<QString>,_std::vector<QCalendarBackend_*,_std::allocator<QCalendarBackend_*>_>_>
  ::keys(&in_RSI->byName);
  QList<QString>::QList(in_RDI,in_stack_ffffffffffffffb8);
  QReadLocker::~QReadLocker((QReadLocker *)0x55e524);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCalendarRegistry::availableCalendars()
{
    ensurePopulated();

    QReadLocker locker(&lock);
    return byName.keys();
}